

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync.cpp
# Opt level: O1

string * __thiscall
bidfx_public_api::price::pixie::SubscriptionSync::Summarize_abi_cxx11_
          (string *__return_storage_ptr__,SubscriptionSync *this)

{
  ostream *poVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"SubscriptionSync(edition=",0x19);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", compressed=",0xd);
  uVar2 = this->options_ & 1;
  pcVar4 = "false";
  pcVar3 = "true";
  if (uVar2 == 0) {
    pcVar3 = "false";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,pcVar3,(ulong)uVar2 ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,", controls=",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", changed=",10);
  bVar5 = (this->options_ & 4) == 0;
  if (bVar5) {
    pcVar4 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,pcVar4,(ulong)bVar5 ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,", subjects=",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string SubscriptionSync::Summarize()
{
    std::stringstream ss;
    ss << "SubscriptionSync(edition=" << edition_ <<
          ", compressed=";

    IsCompressed() ? ss << "true" : ss << "false";

    ss << ", controls=" << controls_.size() << ", changed=";

    IsChangedEdition() ? ss << "true" : ss << "false";

    ss << ", subjects=" << size_ << ")";

    return ss.str();
}